

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

void epoll_fd_state_del(fd_state **fds_p,knote *kn,int ev)

{
  void *__ptr;
  uint in_EDX;
  long in_RSI;
  fd_state *in_RDI;
  kqueue *kq;
  fd_state *fds;
  
  __ptr = *(void **)(in_RSI + 0x70);
  if ((in_EDX & 1) != 0) {
    *(undefined8 *)((long)__ptr + 0x28) = 0;
  }
  if ((in_EDX & 4) != 0) {
    *(undefined8 *)((long)__ptr + 0x30) = 0;
  }
  if ((*(long *)((long)__ptr + 0x28) == 0) && (*(long *)((long)__ptr + 0x30) == 0)) {
    fd_st_RB_REMOVE((fd_st *)kq,in_RDI);
    free(__ptr);
    (in_RDI->fds_entries).rbe_left = (fd_state *)0x0;
  }
  *(undefined8 *)(in_RSI + 0x70) = 0;
  return;
}

Assistant:

void epoll_fd_state_del(struct fd_state **fds_p, struct knote *kn, int ev)
{
    struct fd_state     *fds = kn->kn_fds;
    struct kqueue       *kq = kn->kn_kq;

    assert(ev & (EPOLLIN | EPOLLOUT));
    assert(fds); /* There ~must~ be an entry else something has gone horribly wrong */
    assert(!*fds_p || (*fds_p == kn->kn_fds));

    /*
     * copyin/copyout lock means we don't need
     * to protect operations here.
     */
    if (ev & EPOLLIN) {
        assert(fds->fds_read);
        fds->fds_read = NULL;
    }

    if (ev & EPOLLOUT) {
        assert(fds->fds_write);
        fds->fds_write = NULL;
    }

    if (!fds->fds_read && !fds->fds_write) {
        dbg_printf("fd_state: rm fd=%i", fds->fds_fd);
        RB_REMOVE(fd_st, &kq->kq_fd_st, fds);
        free(fds);
        *fds_p = NULL;
    } else {
        dbg_printf("fd_state: mod fd=%i events=0x%08x (%s)", fds->fds_fd, ev, epoll_flags_dump(ev));
    }
    kn->kn_fds = NULL;
}